

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<TPZVec<int>_>::Resize(TPZVec<TPZVec<int>_> *this,int64_t newsize)

{
  ostream *poVar1;
  int64_t *piVar2;
  TPZVec<int> *pTVar3;
  long lVar4;
  long lVar5;
  TPZVec<int> *pTVar6;
  bool bVar7;
  
  if (newsize < 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ostream::flush();
  }
  lVar5 = this->fNElements;
  if (lVar5 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pTVar3 = this->fStore;
      if (pTVar3 != (TPZVec<int> *)0x0) {
        lVar5 = pTVar3[-1].fNAlloc;
        if (lVar5 != 0) {
          lVar4 = lVar5 << 5;
          do {
            TPZVec<int>::~TPZVec((TPZVec<int> *)((long)&pTVar3[-1]._vptr_TPZVec + lVar4));
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != 0);
        }
        operator_delete__(&pTVar3[-1].fNAlloc,lVar5 << 5 | 8);
      }
      this->fStore = (TPZVec<int> *)0x0;
    }
    else {
      piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize * 0x20 | 8)
      ;
      *piVar2 = newsize;
      pTVar6 = (TPZVec<int> *)(piVar2 + 1);
      pTVar3 = pTVar6;
      do {
        pTVar3->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
        pTVar3->fNAlloc = 0;
        pTVar3->fStore = (int *)0x0;
        pTVar3->fNElements = 0;
        pTVar3 = pTVar3 + 1;
      } while (pTVar3 != (TPZVec<int> *)(piVar2 + newsize * 4 + 1));
      if (newsize <= lVar5) {
        lVar5 = newsize;
      }
      lVar4 = 0;
      if (lVar5 < 1) {
        lVar5 = lVar4;
      }
      while( true ) {
        pTVar3 = this->fStore;
        bVar7 = lVar5 == 0;
        lVar5 = lVar5 + -1;
        if (bVar7) break;
        TPZVec<int>::operator=
                  ((TPZVec<int> *)((long)&pTVar6->_vptr_TPZVec + lVar4),
                   (TPZVec<int> *)((long)&pTVar3->_vptr_TPZVec + lVar4));
        lVar4 = lVar4 + 0x20;
      }
      if (pTVar3 != (TPZVec<int> *)0x0) {
        lVar5 = pTVar3[-1].fNAlloc;
        if (lVar5 != 0) {
          lVar4 = lVar5 << 5;
          do {
            TPZVec<int>::~TPZVec((TPZVec<int> *)((long)&pTVar3[-1]._vptr_TPZVec + lVar4));
            lVar4 = lVar4 + -0x20;
          } while (lVar4 != 0);
        }
        operator_delete__(&pTVar3[-1].fNAlloc,lVar5 << 5 | 8);
      }
      this->fStore = pTVar6;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}